

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

void __thiscall
imrt::EvaluationFunction::get_vc_sorted_beamlets
          (EvaluationFunction *this,Plan *p,vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,
          multimap<double,_std::pair<imrt::Station_*,_int>,_imrt::MagnitudeCompare,_std::allocator<std::pair<const_double,_std::pair<imrt::Station_*,_int>_>_>_>
          *sorted_set)

{
  Station *this_00;
  bool bVar1;
  int iVar2;
  reference ppSVar3;
  Plan *in_RSI;
  pair<imrt::Station_*,_int> *in_R8;
  pair<double,_double> pVar4;
  vector<double,_std::allocator<double>_> *in_stack_00000028;
  vector<double,_std::allocator<double>_> *in_stack_00000030;
  int in_stack_00000038;
  int in_stack_0000003c;
  EvaluationFunction *in_stack_00000040;
  double ev;
  pair<double,_double> value_cost;
  int b;
  Station *s;
  const_iterator __end1;
  const_iterator __begin1;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__range1;
  double max_ev;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_ffffffffffffff38;
  pair<imrt::Station_*,_int> *__y;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  double local_68;
  double local_60;
  int local_54;
  _Self local_48;
  _Self local_40;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *local_38;
  undefined8 local_30;
  pair<imrt::Station_*,_int> *local_28;
  
  local_30 = 0;
  local_28 = in_R8;
  local_38 = Plan::get_stations_abi_cxx11_(in_RSI);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::begin
                 (in_stack_ffffffffffffff38);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::end
                 (in_stack_ffffffffffffff38);
  while (bVar1 = std::operator!=(&local_40,&local_48), bVar1) {
    ppSVar3 = std::_List_const_iterator<imrt::Station_*>::operator*
                        ((_List_const_iterator<imrt::Station_*> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    this_00 = *ppSVar3;
    local_54 = 0;
    while (in_stack_ffffffffffffff44 = local_54, iVar2 = Station::getNbBeamlets((Station *)0x16d404)
          , in_stack_ffffffffffffff44 < iVar2) {
      Station::getAngle(this_00);
      pVar4 = get_value_cost(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030
                             ,in_stack_00000028);
      local_68 = pVar4.first;
      local_60 = pVar4.second;
      if ((local_68 / local_60 != 0.0) || (NAN(local_68 / local_60))) {
        __y = local_28;
        std::make_pair<imrt::Station*&,int&>
                  ((Station **)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (int *)local_28);
        std::make_pair<double&,std::pair<imrt::Station*,int>>
                  ((double *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),__y);
        std::
        multimap<double,std::pair<imrt::Station*,int>,imrt::MagnitudeCompare,std::allocator<std::pair<double_const,std::pair<imrt::Station*,int>>>>
        ::insert<std::pair<double,std::pair<imrt::Station*,int>>>
                  ((multimap<double,_std::pair<imrt::Station_*,_int>,_imrt::MagnitudeCompare,_std::allocator<std::pair<const_double,_std::pair<imrt::Station_*,_int>_>_>_>
                    *)__y,(pair<double,_std::pair<imrt::Station_*,_int>_> *)0x16d4c5);
      }
      local_54 = local_54 + 1;
    }
    std::_List_const_iterator<imrt::Station_*>::operator++(&local_40);
  }
  return;
}

Assistant:

void EvaluationFunction::get_vc_sorted_beamlets(Plan& p, vector<double>& Zmin, vector<double>& Zmax,
		multimap < double, pair<Station*, int>, MagnitudeCompare >& sorted_set){
	//the sorted set of beamlets

	double max_ev=0.0;
	for(auto s:p.get_stations()){
		for(int b=0; b<s->getNbBeamlets(); b++){
			pair<double,double> value_cost=get_value_cost(s->getAngle(), b, Zmin, Zmax);
            double ev=value_cost.first/value_cost.second;
			if(ev==0) continue;
			sorted_set.insert(make_pair (ev,  make_pair(s,b)));
		}
	}

}